

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

base_learner * CSOAA::csldf_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  base_learner *l;
  single_learner *base;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar5;
  vw_exception *pvVar6;
  long lVar7;
  prediction_type_t pred_type;
  undefined **ppuVar8;
  label_parser *plVar9;
  byte bVar10;
  free_ptr<CSOAA::ldf> ld;
  unsigned_long local_6e0;
  allocator local_6d1;
  string ldf_arg;
  option_group_definition csldf_inner_options;
  string wap_ldf;
  string ldf_override;
  string csoaa_ldf;
  stringstream __msg;
  undefined1 local_608 [24];
  size_t sStack_5f0;
  _Alloc_hider local_5e8;
  size_type sStack_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  _Alloc_hider local_5c8;
  size_type sStack_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  bool local_5a8;
  option_group_definition csldf_outer_options;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  typed_option<bool> local_298;
  typed_option<bool> local_1f8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  
  bVar10 = 0;
  scoped_calloc_or_throw<CSOAA::ldf>();
  csoaa_ldf._M_dataplus._M_p = (pointer)&csoaa_ldf.field_2;
  csoaa_ldf._M_string_length = 0;
  ldf_override._M_dataplus._M_p = (pointer)&ldf_override.field_2;
  ldf_override._M_string_length = 0;
  csoaa_ldf.field_2._M_local_buf[0] = '\0';
  ldf_override.field_2._M_local_buf[0] = '\0';
  wap_ldf._M_dataplus._M_p = (pointer)&wap_ldf.field_2;
  wap_ldf._M_string_length = 0;
  wap_ldf.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&local_398,"Cost Sensitive One Against All with Label Dependent Features",
             (allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&csldf_outer_options,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_3b8,"csoaa_ldf",(allocator *)&ldf_arg);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_3b8,&csoaa_ldf);
  local_5a8 = true;
  std::__cxx11::string::string
            ((string *)&csldf_inner_options,
             "Use one-against-all multiclass learning with label dependent features.",
             (allocator *)&local_6e0);
  std::__cxx11::string::_M_assign((string *)&local_5e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_b8,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&csldf_outer_options,&local_b8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_b8);
  std::__cxx11::string::~string((string *)&csldf_inner_options);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&local_3d8,"ldf_override",(allocator *)&ldf_arg);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_3d8,&ldf_override);
  std::__cxx11::string::string
            ((string *)&csldf_inner_options,
             "Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file",
             (allocator *)&local_6e0);
  std::__cxx11::string::_M_assign((string *)&local_5e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_158,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&csldf_outer_options,&local_158);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_158);
  std::__cxx11::string::~string((string *)&csldf_inner_options);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::string((string *)&local_3f8,"csoaa_rank",(allocator *)&ldf_arg);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_3f8,
             &(ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->rank);
  local_5a8 = true;
  std::__cxx11::string::string
            ((string *)&csldf_inner_options,"Return actions sorted by score order",
             (allocator *)&local_6e0);
  std::__cxx11::string::_M_assign((string *)&local_5e8);
  VW::config::typed_option<bool>::typed_option(&local_1f8,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&csldf_outer_options,&local_1f8);
  VW::config::typed_option<bool>::~typed_option(&local_1f8);
  std::__cxx11::string::~string((string *)&csldf_inner_options);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string((string *)&local_418,"probabilities",(allocator *)&ldf_arg);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_418,
             &(ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->is_probabilities);
  local_5a8 = true;
  std::__cxx11::string::string
            ((string *)&csldf_inner_options,"predict probabilites of all classes",
             (allocator *)&local_6e0);
  std::__cxx11::string::_M_assign((string *)&local_5e8);
  VW::config::typed_option<bool>::typed_option(&local_298,(typed_option<bool> *)&__msg);
  VW::config::option_group_definition::add<bool>(&csldf_outer_options,&local_298);
  VW::config::typed_option<bool>::~typed_option(&local_298);
  std::__cxx11::string::~string((string *)&csldf_inner_options);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::string
            ((string *)&local_438,"Cost Sensitive One Against All with Label Dependent Features",
             (allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&csldf_inner_options,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string((string *)&local_458,"wap_ldf",(allocator *)&local_6e0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_458,&wap_ldf);
  local_5a8 = true;
  std::__cxx11::string::string
            ((string *)&ldf_arg,
             "Use weighted all-pairs multiclass learning with label dependent features.  Specify singleline or multiline."
             ,&local_6d1);
  std::__cxx11::string::_M_assign((string *)&local_5e8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_338,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg);
  VW::config::option_group_definition::add<std::__cxx11::string>(&csldf_inner_options,&local_338);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_338);
  std::__cxx11::string::~string((string *)&ldf_arg);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_458);
  (**options->_vptr_options_i)(options,&csldf_outer_options);
  std::__cxx11::string::string((string *)&__msg,"csoaa_ldf",(allocator *)&ldf_arg);
  iVar3 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar3 == '\0') {
    (**options->_vptr_options_i)(options,&csldf_inner_options);
    std::__cxx11::string::string((string *)&__msg,"wap_ldf",(allocator *)&ldf_arg);
    iVar3 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar3 == '\0') {
      plVar5 = (learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
      goto LAB_0020bcb1;
    }
  }
  (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.super__Head_base<0UL,_CSOAA::ldf_*,_false>
  ._M_head_impl)->all = all;
  (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.super__Head_base<0UL,_CSOAA::ldf_*,_false>
  ._M_head_impl)->first_pass = true;
  ldf_arg._M_dataplus._M_p = (pointer)&ldf_arg.field_2;
  ldf_arg._M_string_length = 0;
  ldf_arg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&__msg,"csoaa_ldf",(allocator *)&local_6e0);
  iVar3 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar3 == '\0') {
    std::__cxx11::string::_M_assign((string *)&ldf_arg);
    (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->is_wap = true;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&ldf_arg);
  }
  std::__cxx11::string::string((string *)&__msg,"ldf_override",(allocator *)&local_6e0);
  iVar3 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar3 != '\0') {
    std::__cxx11::string::_M_assign((string *)&ldf_arg);
  }
  if ((ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->rank == true) {
    all->delete_prediction = ACTION_SCORE::delete_action_scores;
  }
  ppuVar8 = &COST_SENSITIVE::cs_label;
  plVar9 = &all->p->lp;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    plVar9->default_label = (_func_void_void_ptr *)*ppuVar8;
    ppuVar8 = ppuVar8 + (ulong)bVar10 * -2 + 1;
    plVar9 = (label_parser *)((long)plVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  all->label_type = cs;
  (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.super__Head_base<0UL,_CSOAA::ldf_*,_false>
  ._M_head_impl)->treat_as_classifier = false;
  iVar3 = std::__cxx11::string::compare((char *)&ldf_arg);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&ldf_arg), iVar3 == 0)) {
    (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->treat_as_classifier = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&ldf_arg);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&ldf_arg), iVar3 == 0)) {
      (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->treat_as_classifier = true;
    }
    else {
      if (all->training == true) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<((ostream *)local_608,
                        "ldf requires either m/multiline or mc/multiline-classifier");
        pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                   ,0x376,&local_358);
        __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      iVar3 = std::__cxx11::string::compare((char *)&ldf_arg);
      if ((((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&ldf_arg), iVar3 == 0))
          || (iVar3 = std::__cxx11::string::compare((char *)&ldf_arg), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((char *)&ldf_arg), iVar3 == 0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<((ostream *)local_608,
                        "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no longer supported"
                       );
        pvVar6 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
                   ,0x37b,&local_378);
        __cxa_throw(pvVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
  }
  if ((ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->is_probabilities == true) {
    all->sd->report_multiclass_log_loss = true;
    (**all->loss->_vptr_loss_function)(&__msg);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__msg,"logistic");
    if (bVar2) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,
                               "WARNING: --probabilities should be used only with --loss_function=logistic"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    if ((ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->treat_as_classifier == false) {
      poVar4 = std::operator<<(&(all->trace_message).super_ostream,
                               "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&__msg);
  }
  all->p->emptylines_separate_examples = true;
  local_5c8._M_p = (pointer)0x0;
  sStack_5c0 = 0;
  local_5d8._M_allocated_capacity = 0;
  local_5d8._8_8_ = 0;
  local_5e8._M_p = (pointer)0x0;
  sStack_5e0 = 0;
  local_608._16_8_ = 0;
  sStack_5f0 = 0;
  local_608._0_8_ = 0;
  local_608._8_8_ = 0;
  ___msg = (pointer)0x0;
  local_5b8._M_allocated_capacity._0_4_ = 0;
  v_hashmap<unsigned_long,_features>::init
            (&(ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->label_features,
             (EVP_PKEY_CTX *)0x100);
  local_6e0 = 1;
  v_hashmap<unsigned_long,_features>::get
            (&(ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->label_features,&local_6e0,
             0x5a5453c);
  if ((ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->rank == false) {
    pred_type = (uint)(ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
                       super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
                       super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl)->is_probabilities *
                2 + multiclass;
  }
  else {
    pred_type = action_scores;
  }
  (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.super__Head_base<0UL,_CSOAA::ldf_*,_false>
  ._M_head_impl)->read_example_this_loop = 0;
  l = setup_base(all->options,all);
  base = LEARNER::as_singleline<char,char>(l);
  plVar5 = LEARNER::learner<CSOAA::ldf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,example>>
                     (ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_CSOAA::ldf_*,_false>._M_head_impl,base,
                      do_actual_learning<true>,do_actual_learning<false>,1,pred_type);
  ld._M_t.super___uniq_ptr_impl<CSOAA::ldf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CSOAA::ldf_*,_void_(*)(void_*)>.super__Head_base<0UL,_CSOAA::ldf_*,_false>.
  _M_head_impl = (ldf *)0x0;
  uVar1 = *(undefined8 *)(plVar5 + 0x18);
  *(undefined8 *)(plVar5 + 0x58) = uVar1;
  *(code **)(plVar5 + 0x68) = finish_multiline_example;
  *(undefined8 *)(plVar5 + 0xb8) = uVar1;
  *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
  *(code **)(plVar5 + 200) = finish;
  *(undefined8 *)(plVar5 + 0x88) = uVar1;
  *(undefined8 *)(plVar5 + 0x90) = *(undefined8 *)(plVar5 + 0x20);
  *(code **)(plVar5 + 0x98) = end_pass;
  all->cost_sensitive = (base_learner *)plVar5;
  std::__cxx11::string::~string((string *)&ldf_arg);
LAB_0020bcb1:
  VW::config::option_group_definition::~option_group_definition(&csldf_inner_options);
  VW::config::option_group_definition::~option_group_definition(&csldf_outer_options);
  std::__cxx11::string::~string((string *)&wap_ldf);
  std::__cxx11::string::~string((string *)&ldf_override);
  std::__cxx11::string::~string((string *)&csoaa_ldf);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::~unique_ptr(&ld);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* csldf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<ldf>();

  std::string csoaa_ldf;
  std::string ldf_override;
  std::string wap_ldf;

  option_group_definition csldf_outer_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_outer_options.add(make_option("csoaa_ldf", csoaa_ldf)
                              .keep()
                              .help("Use one-against-all multiclass learning with label dependent features."));
  csldf_outer_options.add(
      make_option("ldf_override", ldf_override)
          .help("Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file"));
  csldf_outer_options.add(make_option("csoaa_rank", ld->rank).keep().help("Return actions sorted by score order"));
  csldf_outer_options.add(
      make_option("probabilities", ld->is_probabilities).keep().help("predict probabilites of all classes"));

  option_group_definition csldf_inner_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_inner_options.add(make_option("wap_ldf", wap_ldf)
                              .keep()
                              .help("Use weighted all-pairs multiclass learning with label dependent features.  "
                                    "Specify singleline or multiline."));

  options.add_and_parse(csldf_outer_options);
  if (!options.was_supplied("csoaa_ldf"))
  {
    options.add_and_parse(csldf_inner_options);
    if (!options.was_supplied("wap_ldf"))
    {
      return nullptr;
    }
  }

  ld->all = &all;
  ld->first_pass = true;

  string ldf_arg;

  if (options.was_supplied("csoaa_ldf"))
    ldf_arg = csoaa_ldf;
  else
  {
    ldf_arg = wap_ldf;
    ld->is_wap = true;
  }
  if (options.was_supplied("ldf_override"))
    ldf_arg = ldf_override;
  if (ld->rank)
    all.delete_prediction = delete_action_scores;

  all.p->lp = COST_SENSITIVE::cs_label;
  all.label_type = label_type::cs;

  ld->treat_as_classifier = false;
  if (ldf_arg.compare("multiline") == 0 || ldf_arg.compare("m") == 0)
    ld->treat_as_classifier = false;
  else if (ldf_arg.compare("multiline-classifier") == 0 || ldf_arg.compare("mc") == 0)
    ld->treat_as_classifier = true;
  else
  {
    if (all.training)
      THROW("ldf requires either m/multiline or mc/multiline-classifier");
    if ((ldf_arg.compare("singleline") == 0 || ldf_arg.compare("s") == 0) ||
        (ldf_arg.compare("singleline-classifier") == 0 || ldf_arg.compare("sc") == 0))
      THROW(
          "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no "
          "longer supported");
  }

  if (ld->is_probabilities)
  {
    all.sd->report_multiclass_log_loss = true;
    auto loss_function_type = all.loss->getType();
    if (loss_function_type != "logistic")
      all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
    if (!ld->treat_as_classifier)
      all.trace_message << "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)" << endl;
  }

  all.p->emptylines_separate_examples = true;  // TODO: check this to be sure!!!  !ld->is_singleline;

  features fs;
  ld->label_features.init(256, fs, LabelDict::size_t_eq);
  ld->label_features.get(1, 94717244);  // TODO: figure this out
  prediction_type::prediction_type_t pred_type;

  if (ld->rank)
    pred_type = prediction_type::action_scores;
  else if (ld->is_probabilities)
    pred_type = prediction_type::prob;
  else
    pred_type = prediction_type::multiclass;

  ld->read_example_this_loop = 0;
  learner<ldf, multi_ex>& l = init_learner(ld, as_singleline(setup_base(*all.options, all)), do_actual_learning<true>,
      do_actual_learning<false>, 1, pred_type);
  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  l.set_end_pass(end_pass);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}